

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-point.hpp
# Opt level: O3

ostream * __thiscall
diy::DynamicPoint<float,_4UL>::operator<<(DynamicPoint<float,_4UL> *this,ostream *out)

{
  ulong uVar1;
  
  std::ostream::_M_insert<double>
            ((double)*(this->super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>).m_begin);
  if (((long)(this->super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>).m_end -
       (long)(this->super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>).m_begin &
      0x3fffffff8U) != 0) {
    uVar1 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
      std::ostream::_M_insert<double>
                ((double)(this->super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>).m_begin
                         [uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < ((ulong)((long)(this->
                                    super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>).
                                    m_end -
                             (long)(this->
                                   super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>).
                                   m_begin) >> 2 & 0xffffffff));
  }
  return out;
}

Assistant:

std::ostream&       operator<<(std::ostream& out) const     { out << (*this)[0]; for (size_t i = 1; i < dimension(); ++i) out << " " << (*this)[i]; return out; }